

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dot.h
# Opt level: O0

PlainObject * __thiscall
Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
          (PlainObject *__return_storage_ptr__,
          MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this)

{
  undefined1 auVar1 [16];
  RealScalar this_00;
  double local_a0;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_98;
  RealScalar local_78;
  RealScalar z;
  _Nested n;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_local;
  Packet2d local_58;
  RealScalar *local_40;
  RealScalar local_38;
  undefined8 uStack_30;
  RealScalar local_28;
  undefined8 uStack_20;
  RealScalar local_10;
  
  n = (_Nested)this;
  this_local = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)__return_storage_ptr__;
  z = (RealScalar)
      EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::derived
                ((EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this);
  local_78 = squaredNorm((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)z);
  this_00 = z;
  if (local_78 <= 0.0) {
    Matrix<double,_3,_1,_0,_3,_1>::Matrix(__return_storage_ptr__,(Matrix<double,_3,_1,_0,_3,_1> *)z)
    ;
  }
  else {
    local_40 = &local_78;
    uStack_20 = 0;
    uStack_30 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_78;
    local_58 = (Packet2d)sqrtpd(auVar1,auVar1);
    local_38 = local_78;
    local_28 = local_78;
    local_10 = local_78;
    local_a0 = internal::pfirst<double__vector(2)>(&local_58);
    MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (&local_98,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)this_00,&local_a0);
    Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,3,1,0,3,1> *)__return_storage_ptr__,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

typename MatrixBase<Derived>::PlainObject
MatrixBase<Derived>::normalized() const
{
  typedef typename internal::nested_eval<Derived,2>::type _Nested;
  _Nested n(derived());
  RealScalar z = n.squaredNorm();
  // NOTE: after extensive benchmarking, this conditional does not impact performance, at least on recent x86 CPU
  if(z>RealScalar(0))
    return n / numext::sqrt(z);
  else
    return n;
}